

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_dense.c
# Opt level: O3

void SUNDlsMat_denseGETRS(sunrealtype **a,sunindextype n,sunindextype *p,sunrealtype *b)

{
  sunrealtype sVar1;
  sunrealtype *psVar2;
  bool bVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  
  if (0 < n) {
    lVar4 = 0;
    do {
      lVar6 = p[lVar4];
      if (lVar4 != lVar6) {
        sVar1 = b[lVar4];
        b[lVar4] = b[lVar6];
        b[lVar6] = sVar1;
      }
      lVar4 = lVar4 + 1;
    } while (n != lVar4);
    if (n != 1) {
      lVar4 = 0;
      do {
        psVar2 = a[lVar4];
        lVar5 = lVar4 + 1;
        lVar6 = lVar5;
        do {
          b[lVar6] = b[lVar6] - psVar2[lVar6] * b[lVar4];
          lVar6 = lVar6 + 1;
        } while (lVar6 < n);
        lVar4 = lVar5;
      } while (lVar5 != n + -1);
      lVar4 = n + -1;
      if (n != 1) {
        do {
          psVar2 = a[lVar4];
          b[lVar4] = b[lVar4] / psVar2[lVar4];
          lVar6 = 0;
          do {
            b[lVar6] = b[lVar6] - psVar2[lVar6] * b[lVar4];
            lVar6 = lVar6 + 1;
          } while (lVar6 < lVar4);
          bVar3 = 1 < lVar4;
          lVar4 = lVar4 + -1;
        } while (bVar3);
      }
    }
  }
  *b = *b / **a;
  return;
}

Assistant:

void SUNDlsMat_denseGETRS(sunrealtype** a, sunindextype n, sunindextype* p,
                          sunrealtype* b)
{
  sunindextype i, k, pk;
  sunrealtype *col_k, tmp;

  /* Permute b, based on pivot information in p */
  for (k = 0; k < n; k++)
  {
    pk = p[k];
    if (pk != k)
    {
      tmp   = b[k];
      b[k]  = b[pk];
      b[pk] = tmp;
    }
  }

  /* Solve Ly = b, store solution y in b */
  for (k = 0; k < n - 1; k++)
  {
    col_k = a[k];
    for (i = k + 1; i < n; i++) { b[i] -= col_k[i] * b[k]; }
  }

  /* Solve Ux = y, store solution x in b */
  for (k = n - 1; k > 0; k--)
  {
    col_k = a[k];
    b[k] /= col_k[k];
    for (i = 0; i < k; i++) { b[i] -= col_k[i] * b[k]; }
  }
  b[0] /= a[0][0];
}